

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_SENSITIVE_COMPOSITE_Unmarshal
                 (TPMU_SENSITIVE_COMPOSITE *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_SENSITIVE_COMPOSITE *target_local;
  
  switch(selector) {
  case 1:
    target_local._4_4_ = TPM2B_PRIVATE_KEY_RSA_Unmarshal(&target->rsa,buffer,size);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 8:
    target_local._4_4_ = TPM2B_SENSITIVE_DATA_Unmarshal(&target->bits,buffer,size);
    break;
  case 0x23:
    target_local._4_4_ = TPM2B_ECC_PARAMETER_Unmarshal(&target->ecc,buffer,size);
    break;
  case 0x25:
    target_local._4_4_ = TPM2B_SYM_KEY_Unmarshal(&target->sym,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_SENSITIVE_COMPOSITE_Unmarshal(TPMU_SENSITIVE_COMPOSITE *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Unmarshal((TPM2B_PRIVATE_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Unmarshal((TPM2B_SENSITIVE_DATA *)&(target->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Unmarshal((TPM2B_SYM_KEY *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return TPM_RC_SELECTOR;
}